

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::encode_rice(symbol_codec *this,uint v,uint m)

{
  undefined4 local_1c;
  uint r;
  uint q;
  uint m_local;
  uint v_local;
  symbol_codec *this_local;
  
  for (local_1c = v >> ((byte)m & 0x1f); 0x10 < local_1c; local_1c = local_1c - 0x10) {
    encode_bits(this,0xffff,0x10);
  }
  if (local_1c != 0) {
    encode_bits(this,(1 << ((byte)local_1c & 0x1f)) - 1,local_1c);
  }
  encode_bits(this,0,1);
  encode_bits(this,v & (1 << ((byte)m & 0x1f)) - 1U,m);
  return;
}

Assistant:

void symbol_codec::encode_rice(uint v, uint m)
    {
        CRNLIB_ASSERT(m > 0);

        uint q = v >> m;
        uint r = v & ((1 << m) - 1);

        while (q > 16)
        {
            encode_bits(0xFFFF, 16);
            q -= 16;
        }

        if (q)
        {
            encode_bits((1 << q) - 1, q);
        }

        encode_bits(0, 1);

        encode_bits(r, m);
    }